

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

_Bool al_peek_next_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event)

{
  _func_void *p_Var1;
  ALLEGRO_SYSTEM *pAVar2;
  undefined8 *puVar3;
  long lVar4;
  _Bool _Var5;
  ALLEGRO_EVENT *pAVar6;
  byte bVar7;
  
  bVar7 = 0;
  pAVar2 = al_get_system_driver();
  p_Var1 = pAVar2->vt->heartbeat;
  if (p_Var1 != (_func_void *)0x0) {
    (*p_Var1)();
  }
  if ((queue->mutex).inited == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  if (queue->events_head != queue->events_tail) {
    puVar3 = (undefined8 *)_al_vector_ref(&queue->events,queue->events_tail);
    if (puVar3 != (undefined8 *)0x0) {
      pAVar6 = ret_event;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined8 *)pAVar6 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pAVar6 = (ALLEGRO_EVENT *)((long)pAVar6 + (ulong)bVar7 * -0x10 + 8);
      }
      ref_if_user_event(ret_event);
      _Var5 = true;
      goto LAB_001590c9;
    }
  }
  _Var5 = false;
LAB_001590c9:
  if ((queue->mutex).inited == true) {
    pthread_mutex_unlock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  return _Var5;
}

Assistant:

bool al_peek_next_event(ALLEGRO_EVENT_QUEUE *queue, ALLEGRO_EVENT *ret_event)
{
   ALLEGRO_EVENT *next_event;
   ASSERT(queue);
   ASSERT(ret_event);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   next_event = get_next_event_if_any(queue, false);
   if (next_event) {
      copy_event(ret_event, next_event);
      ref_if_user_event(ret_event);
   }

   _al_mutex_unlock(&queue->mutex);

   return (next_event ? true : false);
}